

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_fwd_txfm.c
# Opt level: O2

void av1_fwht4x4_c(int16_t *input,tran_low_t *output,int stride)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  for (lVar3 = 0; (int)lVar3 != 0x20; lVar3 = lVar3 + 8) {
    lVar4 = (long)*input + (long)(int)input[stride];
    lVar1 = (long)input[stride * 3] - (long)input[stride * 2];
    iVar5 = (int)((ulong)(lVar4 - lVar1) >> 1);
    iVar2 = iVar5 - input[stride];
    iVar5 = iVar5 - input[stride * 2];
    *(int *)((long)output + lVar3 * 2) = (int)lVar4 - iVar5;
    *(int *)((long)output + lVar3 * 2 + 4) = iVar5;
    *(int *)((long)output + lVar3 * 2 + 8) = (int)lVar1 + iVar2;
    *(int *)((long)output + lVar3 * 2 + 0xc) = iVar2;
    input = input + 1;
  }
  for (lVar3 = 0; (int)lVar3 != 4; lVar3 = lVar3 + 1) {
    lVar1 = (ulong)(uint)output[lVar3] + (ulong)(uint)output[lVar3 + 4];
    lVar4 = (ulong)(uint)output[lVar3 + 0xc] - (ulong)(uint)output[lVar3 + 8];
    iVar2 = (int)((ulong)(lVar1 - lVar4) >> 1);
    iVar5 = iVar2 - output[lVar3 + 4];
    iVar2 = iVar2 - output[lVar3 + 8];
    output[lVar3] = ((int)lVar1 - iVar2) * 4;
    output[lVar3 + 4] = iVar2 * 4;
    output[lVar3 + 8] = ((int)lVar4 + iVar5) * 4;
    output[lVar3 + 0xc] = iVar5 * 4;
  }
  return;
}

Assistant:

void av1_fwht4x4_c(const int16_t *input, tran_low_t *output, int stride) {
  int i;
  tran_high_t a1, b1, c1, d1, e1;
  const int16_t *ip_pass0 = input;
  const tran_low_t *ip = NULL;
  tran_low_t *op = output;

  for (i = 0; i < 4; i++) {
    a1 = ip_pass0[0 * stride];
    b1 = ip_pass0[1 * stride];
    c1 = ip_pass0[2 * stride];
    d1 = ip_pass0[3 * stride];

    a1 += b1;
    d1 = d1 - c1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= c1;
    d1 += b1;
    op[0] = (tran_low_t)a1;
    op[1] = (tran_low_t)c1;
    op[2] = (tran_low_t)d1;
    op[3] = (tran_low_t)b1;

    ip_pass0++;
    op += 4;
  }
  ip = output;
  op = output;

  for (i = 0; i < 4; i++) {
    a1 = ip[4 * 0];
    b1 = ip[4 * 1];
    c1 = ip[4 * 2];
    d1 = ip[4 * 3];

    a1 += b1;
    d1 -= c1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= c1;
    d1 += b1;
    op[4 * 0] = (tran_low_t)(a1 * UNIT_QUANT_FACTOR);
    op[4 * 1] = (tran_low_t)(c1 * UNIT_QUANT_FACTOR);
    op[4 * 2] = (tran_low_t)(d1 * UNIT_QUANT_FACTOR);
    op[4 * 3] = (tran_low_t)(b1 * UNIT_QUANT_FACTOR);

    ip++;
    op++;
  }
}